

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_text.c
# Opt level: O0

void text_search_list(t_text_search *x,t_symbol *s,int argc,t_atom *argv)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  _binbuf *x_00;
  t_atom *ptVar4;
  float local_80;
  float local_7c;
  float d2;
  float d1;
  float bestv;
  float thisv;
  int binop;
  int field;
  int j;
  int thisn;
  t_atom *vec;
  int failed;
  int nkeys;
  int thisstart;
  int bestn;
  int beststart;
  int bestline;
  int lineno;
  int n;
  int i;
  _binbuf *b;
  t_atom *argv_local;
  int argc_local;
  t_symbol *s_local;
  t_text_search *x_local;
  
  x_00 = text_client_getbuf(&x->x_tc);
  bestn = -1;
  thisstart = -1;
  uVar1 = x->x_nkeys;
  bVar2 = false;
  if (x_00 != (_binbuf *)0x0) {
    if (argc < (int)uVar1) {
      pd_error(x,"need %d keys, only got %d in list",(ulong)uVar1,(ulong)(uint)argc);
    }
    ptVar4 = binbuf_getvec(x_00);
    iVar3 = binbuf_getnatom(x_00);
    if ((int)uVar1 < 1) {
      bug("text_search");
    }
    failed = 0;
    beststart = 0;
    for (lineno = 0; lineno < iVar3; lineno = lineno + 1) {
      if (((ptVar4[lineno].a_type == A_SEMI) || (ptVar4[lineno].a_type == A_COMMA)) ||
         (lineno == iVar3 + -1)) {
        if (x->x_onset <= beststart) {
          if (x->x_onset + x->x_range <= beststart) break;
          thisv = (float)x->x_keyvec->k_field;
          bestv = (float)x->x_keyvec->k_binop;
          binop = 0;
          while (binop < argc) {
            if ((lineno - failed <= (int)thisv) ||
               (ptVar4[failed + (int)thisv].a_type != argv[binop].a_type)) goto LAB_001d23de;
            if (argv[binop].a_type == A_FLOAT) {
              switch(bestv) {
              case 0.0:
                if ((ptVar4[failed + (int)thisv].a_w.w_float != argv[binop].a_w.w_float) ||
                   (NAN(ptVar4[failed + (int)thisv].a_w.w_float) || NAN(argv[binop].a_w.w_float)))
                goto LAB_001d23de;
                break;
              case 1.4013e-45:
                if (ptVar4[failed + (int)thisv].a_w.w_float <= argv[binop].a_w.w_float)
                goto LAB_001d23de;
                break;
              case 2.8026e-45:
                if (ptVar4[failed + (int)thisv].a_w.w_float < argv[binop].a_w.w_float)
                goto LAB_001d23de;
                break;
              case 4.2039e-45:
                if (argv[binop].a_w.w_float <= ptVar4[failed + (int)thisv].a_w.w_float)
                goto LAB_001d23de;
                break;
              case 5.60519e-45:
                if (argv[binop].a_w.w_float <= ptVar4[failed + (int)thisv].a_w.w_float &&
                    ptVar4[failed + (int)thisv].a_w.w_float != argv[binop].a_w.w_float)
                goto LAB_001d23de;
              }
            }
            else {
              if (bestv != 0.0) {
                if (!bVar2) {
                  pd_error(x,"text search (%s): only exact matches allowed for symbols",
                           (argv[binop].a_w.w_symbol)->s_name);
                  bVar2 = true;
                }
                goto LAB_001d23de;
              }
              if (ptVar4[failed + (int)thisv].a_w.w_symbol != argv[binop].a_w.w_symbol)
              goto LAB_001d23de;
            }
            binop = binop + 1;
            if (binop < (int)uVar1) {
              thisv = (float)x->x_keyvec[binop].k_field;
              bestv = (float)x->x_keyvec[binop].k_binop;
            }
            else {
              thisv = (float)((int)thisv + 1);
            }
          }
          if (bestn < 0) {
LAB_001d23dc:
            thisstart = failed;
            bestn = beststart;
          }
          else {
            thisv = (float)x->x_keyvec->k_field;
            bestv = (float)x->x_keyvec->k_binop;
            binop = 0;
            while (binop < argc) {
              if ((lineno - failed <= (int)thisv) ||
                 (ptVar4[failed + (int)thisv].a_type != argv[binop].a_type)) {
                bug("text search 2");
              }
              if (argv[binop].a_type == A_FLOAT) {
                local_7c = ptVar4[failed + (int)thisv].a_w.w_float;
                if (thisstart < 0) {
                  local_80 = -1e+20;
                }
                else {
                  local_80 = ptVar4[thisstart + (int)thisv].a_w.w_float;
                }
                if ((int)bestv - 1U < 2) {
                  if (local_7c < local_80) goto LAB_001d23dc;
joined_r0x001d21ce:
                  if (local_80 < local_7c) break;
                }
                else if ((int)bestv - 3U < 2) {
                  if (local_80 < local_7c) goto LAB_001d23dc;
joined_r0x001d21f9:
                  if (local_7c < local_80) break;
                }
                else if (bestv == 7.00649e-45) {
                  if ((argv[binop].a_w.w_float <= local_7c) && (argv[binop].a_w.w_float <= local_80)
                     ) {
                    if (local_80 <= local_7c) goto joined_r0x001d21ce;
                    goto LAB_001d23dc;
                  }
                  if ((local_7c <= argv[binop].a_w.w_float) && (local_80 <= argv[binop].a_w.w_float)
                     ) {
                    if (local_7c <= local_80) goto joined_r0x001d21f9;
                    goto LAB_001d23dc;
                  }
                  local_7c = local_7c - argv[binop].a_w.w_float;
                  local_80 = local_80 - argv[binop].a_w.w_float;
                  if (local_7c < 0.0) {
                    local_7c = -local_7c;
                  }
                  if (local_80 < 0.0) {
                    local_80 = -local_80;
                  }
                  if (local_7c < local_80) goto LAB_001d23dc;
                  if (local_80 < local_7c) break;
                }
              }
              binop = binop + 1;
              if (binop < (int)uVar1) {
                thisv = (float)x->x_keyvec[binop].k_field;
                bestv = (float)x->x_keyvec[binop].k_binop;
              }
              else {
                thisv = (float)((int)thisv + 1);
              }
            }
          }
        }
LAB_001d23de:
        beststart = beststart + 1;
        failed = lineno + 1;
      }
    }
    outlet_float(x->x_out1,(float)bestn);
  }
  return;
}

Assistant:

static void text_search_list(t_text_search *x,
    t_symbol *s, int argc, t_atom *argv)
{
    t_binbuf *b = text_client_getbuf(&x->x_tc);
    int i, n, lineno, bestline = -1, beststart=-1, bestn, thisstart,
        nkeys = x->x_nkeys, failed = 0;
    t_atom *vec;
    if (!b)
       return;
    if (argc < nkeys)
    {
        pd_error(x, "need %d keys, only got %d in list",
            nkeys, argc);
    }
    vec = binbuf_getvec(b);
    n = binbuf_getnatom(b);
    if (nkeys < 1)
        bug("text_search");
    for (i = lineno = thisstart = 0; i < n; i++)
    {
        if (vec[i].a_type == A_SEMI || vec[i].a_type == A_COMMA || i == n-1)
        {
            int thisn, j, field, binop;
            if (lineno < x->x_onset)
                goto nomatch;
            if (lineno >= x->x_onset + x->x_range)
                break;
            thisn = i - thisstart;
            field = x->x_keyvec[0].k_field;
            binop = x->x_keyvec[0].k_binop;
                /* do we match? */
            for (j = 0; j < argc; )
            {
                if (field >= thisn ||
                    vec[thisstart+field].a_type != argv[j].a_type)
                        goto nomatch;
                if (argv[j].a_type == A_FLOAT)      /* arg is a float */
                {
                    switch (binop)
                    {
                        case KB_EQ:
                            if (vec[thisstart+field].a_w.w_float !=
                                argv[j].a_w.w_float)
                                    goto nomatch;
                        break;
                        case KB_GT:
                            if (vec[thisstart+field].a_w.w_float <=
                                argv[j].a_w.w_float)
                                    goto nomatch;
                        break;
                        case KB_GE:
                            if (vec[thisstart+field].a_w.w_float <
                                argv[j].a_w.w_float)
                                    goto nomatch;
                        break;
                        case KB_LT:
                            if (vec[thisstart+field].a_w.w_float >=
                                argv[j].a_w.w_float)
                                    goto nomatch;
                        break;
                        case KB_LE:
                            if (vec[thisstart+field].a_w.w_float >
                                argv[j].a_w.w_float)
                                    goto nomatch;
                        break;
                            /* the other possibility ('near') never fails */
                    }
                }
                else                                /* arg is a symbol */
                {
                    if (binop != KB_EQ)
                    {
                        if (!failed)
                        {
                            pd_error(x,
                    "text search (%s): only exact matches allowed for symbols",
                                argv[j].a_w.w_symbol->s_name);
                            failed = 1;
                        }
                        goto nomatch;
                    }
                    if (vec[thisstart+field].a_w.w_symbol !=
                        argv[j].a_w.w_symbol)
                            goto nomatch;
                }
                if (++j >= nkeys)    /* if at last key just increment field */
                    field++;
                else field = x->x_keyvec[j].k_field,    /* else next key */
                        binop = x->x_keyvec[j].k_binop;
            }
                /* the line matches.  Now, if there is a previous match, are
                we better than it? */
            if (bestline >= 0)
            {
                field = x->x_keyvec[0].k_field;
                binop = x->x_keyvec[0].k_binop;
                for (j = 0; j < argc; )
                {
                    if (field >= thisn
                        || vec[thisstart+field].a_type != argv[j].a_type)
                            bug("text search 2");
                    if (argv[j].a_type == A_FLOAT)      /* arg is a float */
                    {
                        float thisv = vec[thisstart+field].a_w.w_float,
                            bestv = (beststart >= 0 ?
                                vec[beststart+field].a_w.w_float : -1e20);
                        switch (binop)
                        {
                            case KB_GT:
                            case KB_GE:
                                if (thisv < bestv)
                                    goto replace;
                                else if (thisv > bestv)
                                    goto nomatch;
                            break;
                            case KB_LT:
                            case KB_LE:
                                if (thisv > bestv)
                                    goto replace;
                                else if (thisv < bestv)
                                    goto nomatch;
                            break;
                            case KB_NEAR:
                                if (thisv >= argv[j].a_w.w_float &&
                                    bestv >= argv[j].a_w.w_float)
                                {
                                    if (thisv < bestv)
                                        goto replace;
                                    else if (thisv > bestv)
                                        goto nomatch;
                                }
                                else if (thisv <= argv[j].a_w.w_float &&
                                    bestv <= argv[j].a_w.w_float)
                                {
                                    if (thisv > bestv)
                                        goto replace;
                                    else if (thisv < bestv)
                                        goto nomatch;
                                }
                                else
                                {
                                    float d1 = thisv - argv[j].a_w.w_float,
                                        d2 = bestv - argv[j].a_w.w_float;
                                    if (d1 < 0)
                                        d1 = -d1;
                                    if (d2 < 0)
                                        d2 = -d2;

                                    if (d1 < d2)
                                        goto replace;
                                    else if (d1 > d2)
                                        goto nomatch;
                                }
                            break;
                                /* the other possibility ('=') never decides */
                        }
                    }
                    if (++j >= nkeys)    /* last key - increment field */
                        field++;
                    else field = x->x_keyvec[j].k_field,    /* else next key */
                            binop = x->x_keyvec[j].k_binop;
                }
                goto nomatch;   /* a tie - keep the old one */
            replace:
                bestline = lineno, beststart = thisstart, bestn = thisn;
            }
                /* no previous match so we're best */
            else bestline = lineno, beststart = thisstart, bestn = thisn;
        nomatch:
            lineno++;
            thisstart = i+1;
        }
    }
    outlet_float(x->x_out1, bestline);
}